

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedArray.cpp
# Opt level: O0

uint32_t __thiscall CompressedArray::calculate_value_size(CompressedArray *this,Value value)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  CompressedArray *in_RDI;
  uint32_t index;
  uint32_t size;
  uint *in_stack_00000048;
  Vocabulary<unsigned_int> *in_stack_00000050;
  
  uVar1 = Vocabulary<unsigned_int>::get_index(in_stack_00000050,in_stack_00000048);
  uVar1 = calculate_number_size(in_RDI,uVar1,in_RDI->ngram_count_index_log_radix);
  uVar2 = Vocabulary<unsigned_int>::get_index(in_stack_00000050,in_stack_00000048);
  uVar2 = calculate_number_size(in_RDI,uVar2,in_RDI->continuations_count_index_log_radix);
  uVar3 = Vocabulary<unsigned_int>::get_index(in_stack_00000050,in_stack_00000048);
  uVar3 = calculate_number_size(in_RDI,uVar3,in_RDI->unique_continuations_count_index_log_radix);
  return uVar3 + uVar2 + uVar1;
}

Assistant:

uint32_t CompressedArray::calculate_value_size(Value value) const {
    uint32_t size = 0;
    uint32_t index = ngram_count_values.get_index(value.ngram_count);
    size += calculate_number_size(index, ngram_count_index_log_radix);
    index = continuations_count_values.get_index(value.continuations_count);
    size += calculate_number_size(index, continuations_count_index_log_radix);
    index = unique_continuations_count_values.get_index(value.unique_continuations_count);
    size += calculate_number_size(index, unique_continuations_count_index_log_radix);
    return size;
}